

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

data_ptr_t duckdb::Allocator::DefaultAllocate(PrivateAllocatorData *private_data,idx_t size)

{
  data_ptr_t pdVar1;
  
  pdVar1 = (data_ptr_t)duckdb_je_malloc(size);
  return pdVar1;
}

Assistant:

data_ptr_t Allocator::DefaultAllocate(PrivateAllocatorData *private_data, idx_t size) {
#ifdef USE_JEMALLOC
	return JemallocExtension::Allocate(private_data, size);
#else
	auto default_allocate_result = malloc(size);
	if (!default_allocate_result) {
		throw std::bad_alloc();
	}
	return data_ptr_cast(default_allocate_result);
#endif
}